

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall soplex::SPxSteepPR<double>::selectEnterX(SPxSteepPR<double> *this,double tol)

{
  SPxSolverBase<double> *pSVar1;
  double *pdVar2;
  DataKey *pDVar3;
  double bestCo;
  double best;
  SPxId enterId;
  SPxId enterCoId;
  double local_38;
  double local_30;
  DataKey local_28;
  DataKey local_20;
  undefined4 local_18;
  uint uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_28.info = 0;
  local_28.idx = -1;
  local_20.info = 0;
  local_20.idx = -1;
  ::soplex::infinity::__tls_init();
  pdVar2 = (double *)__tls_get_addr(&PTR_003b6b60);
  local_30 = *pdVar2;
  local_18 = SUB84(local_30,0);
  uStack_14 = (uint)((ulong)local_30 >> 0x20) ^ 0x80000000;
  local_30 = -local_30;
  uStack_10 = 0;
  uStack_c = 0x80000000;
  ::soplex::infinity::__tls_init();
  local_38 = (double)CONCAT44(uStack_14,local_18);
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  if ((pSVar1->hyperPricingEnter == true) && (this->refined == false)) {
    if (((this->bestPrices).super_IdxSet.num < 2) ||
       ((pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      if (pSVar1->sparsePricingEnter != true) goto LAB_00232375;
      local_20 = (DataKey)buildBestPriceVectorEnterDim(this,&local_30,tol);
    }
    else if (pSVar1->sparsePricingEnter == true) {
      local_20 = (DataKey)selectEnterHyperDim(this,&local_30,tol);
    }
    else {
LAB_00232375:
      local_20 = (DataKey)selectEnterDenseDim(this,&local_30,tol);
    }
    if (((this->bestPricesCo).super_IdxSet.num < 2) ||
       (pSVar1 = (this->super_SPxPricer<double>).thesolver,
       (pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      if (((this->super_SPxPricer<double>).thesolver)->sparsePricingEnterCo == true) {
        local_28 = (DataKey)buildBestPriceVectorEnterCoDim(this,&local_38,tol);
        goto LAB_002323f6;
      }
    }
    else if (pSVar1->sparsePricingEnterCo == true) {
      local_28 = (DataKey)selectEnterHyperCoDim(this,&local_38,tol);
      goto LAB_002323f6;
    }
  }
  else {
    if ((pSVar1->sparsePricingEnter == true) && (this->refined == false)) {
      local_20 = (DataKey)selectEnterSparseDim(this,&local_30,tol);
    }
    else {
      local_20 = (DataKey)selectEnterDenseDim(this,&local_30,tol);
    }
    if ((((this->super_SPxPricer<double>).thesolver)->sparsePricingEnterCo == true) &&
       (this->refined == false)) {
      local_28 = (DataKey)selectEnterSparseCoDim(this,&local_38,tol);
      goto LAB_002323f6;
    }
  }
  local_28 = (DataKey)selectEnterDenseCoDim(this,&local_38,tol);
LAB_002323f6:
  if ((local_20.info == 0) ||
     ((pDVar3 = &local_20, local_30 <= local_38 * 0.8 && (local_28.info != 0)))) {
    pDVar3 = &local_28;
  }
  return (SPxId)*pDVar3;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = R(-infinity);
   bestCo = R(-infinity);

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}